

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DeadInsertElimPass::EliminateDeadInsertsOnePass
          (DeadInsertElimPass *this,Function *func)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  Op OVar1;
  IRContext *pIVar2;
  DefUseManager *this_01;
  uint32_t uVar3;
  int32_t iVar4;
  Instruction *pIVar5;
  iterator iVar6;
  __node_base_ptr p_Var7;
  BasicBlock *pBVar8;
  bool bVar9;
  uint uVar10;
  __node_base_ptr p_Var11;
  __hashtable *__h;
  uint32_t id;
  uint32_t local_7c;
  Instruction *local_78;
  Instruction *pIStack_70;
  Instruction *local_68;
  IRContext *local_58;
  _Any_data local_50;
  pointer local_40;
  code *local_38;
  
  this_00 = &this->liveInserts_;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&this_00->_M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->visitedPhis_)._M_h);
  p_Var11 = (__node_base_ptr)
            (func->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var7 = (__node_base_ptr)
           (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var11 != p_Var7) {
    local_58 = (IRContext *)func;
    do {
      pBVar8 = (((__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                  *)&p_Var11->_M_nxt)->
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               )._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      local_78 = *(Instruction **)
                  ((long)&(pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      if (local_78 !=
          (Instruction *)
          ((long)&(pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
        do {
          OVar1 = local_78->opcode_;
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          this_01 = (pIVar2->def_use_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                    _M_head_impl;
          uVar3 = 0;
          if (local_78->has_type_id_ == true) {
            uVar3 = Instruction::GetSingleWordOperand(local_78,0);
          }
          pIVar5 = analysis::DefUseManager::GetDef(this_01,uVar3);
          if (OVar1 == OpCompositeInsert) {
            if (pIVar5->opcode_ != OpTypeArray) goto LAB_001ecaa4;
            uVar3 = 0;
            if (local_78->has_result_id_ == true) {
              uVar3 = Instruction::GetSingleWordOperand(local_78,(uint)local_78->has_type_id_);
            }
            local_7c = uVar3;
            local_50._M_unused._0_8_ = (undefined8)this_00;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)this_00,&local_7c,&local_50);
          }
          else if ((OVar1 == OpPhi) && (iVar4 = spvOpcodeIsComposite(pIVar5->opcode_), iVar4 != 0))
          {
LAB_001ecaa4:
            uVar3 = 0;
            if (local_78->has_result_id_ == true) {
              uVar3 = Instruction::GetSingleWordOperand(local_78,(uint)local_78->has_type_id_);
            }
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            local_50._M_unused._M_object = &local_78;
            local_38 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:195:42)>
                       ::_M_invoke;
            local_40 = (pointer)std::
                                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:195:42)>
                                ::_M_manager;
            local_50._8_8_ = this;
            analysis::DefUseManager::ForEachUser
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar3,(function<void_(spvtools::opt::Instruction_*)> *)&local_50
                      );
            if (local_40 != (pointer)0x0) {
              (*(code *)local_40)(&local_50,&local_50,3);
            }
          }
          local_78 = (local_78->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (local_78 !=
                 (Instruction *)
                 ((long)&(((((__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                              *)&p_Var11->_M_nxt)->
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           )._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)
                         ->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U));
        p_Var7 = (local_58->instr_to_block_)._M_h._M_single_bucket;
      }
      p_Var11 = p_Var11 + 1;
    } while (p_Var11 != p_Var7);
    p_Var11 = (__node_base_ptr)(local_58->instr_to_block_)._M_h._M_rehash_policy._M_next_resize;
    local_78 = (Instruction *)0x0;
    pIStack_70 = (Instruction *)0x0;
    local_68 = (Instruction *)0x0;
    if (p_Var11 != p_Var7) {
      bVar9 = false;
      do {
        pBVar8 = (((__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                    *)&p_Var11->_M_nxt)->
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 )._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        pIVar5 = *(Instruction **)
                  ((long)&(pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        if (pIVar5 != (Instruction *)
                      ((long)&(pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)
           ) {
          do {
            if (pIVar5->opcode_ == OpCompositeInsert) {
              uVar3 = 0;
              if (pIVar5->has_result_id_ == true) {
                uVar3 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
              }
              local_7c = uVar3;
              iVar6 = std::
                      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::find(&this_00->_M_h,&local_7c);
              if (iVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
              {
                uVar10 = (pIVar5->has_result_id_ & 1) + 1;
                if (pIVar5->has_type_id_ == false) {
                  uVar10 = (uint)pIVar5->has_result_id_;
                }
                uVar3 = Instruction::GetSingleWordOperand(pIVar5,uVar10 + 1);
                IRContext::ReplaceAllUsesWith
                          ((this->super_MemPass).super_Pass.context_,local_7c,uVar3);
                local_50._M_unused._0_8_ = (undefined8)pIVar5;
                std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                ::emplace_back<spvtools::opt::Instruction*>
                          ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                            *)&local_78,(Instruction **)&local_50);
                bVar9 = true;
              }
              pBVar8 = (((__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                          *)&p_Var11->_M_nxt)->
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            }
            pIVar5 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          } while (pIVar5 != &(pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                              sentinel_);
          p_Var7 = (local_58->instr_to_block_)._M_h._M_single_bucket;
        }
        p_Var11 = p_Var11 + 1;
      } while (p_Var11 != p_Var7);
      if (local_78 != pIStack_70) {
        do {
          pIVar5 = pIStack_70 + -1;
          pIStack_70 = (Instruction *)&pIStack_70[-1].dbg_scope_;
          local_50._8_8_ = (DeadInsertElimPass *)0x0;
          local_50._M_unused._M_object = &local_78;
          local_38 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:241:19)>
                     ::_M_invoke;
          local_40 = (pointer)std::
                              _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:241:19)>
                              ::_M_manager;
          MemPass::DCEInst(&this->super_MemPass,(Instruction *)pIVar5->dbg_scope_,
                           (function<void_(spvtools::opt::Instruction_*)> *)&local_50);
          if (local_40 != (pointer)0x0) {
            (*(code *)local_40)(&local_50,&local_50,3);
          }
        } while (local_78 != pIStack_70);
      }
      if (local_78 == (Instruction *)0x0) {
        return bVar9;
      }
      operator_delete(local_78,(long)local_68 - (long)local_78);
      return bVar9;
    }
  }
  return false;
}

Assistant:

bool DeadInsertElimPass::EliminateDeadInsertsOnePass(Function* func) {
  bool modified = false;
  liveInserts_.clear();
  visitedPhis_.clear();
  // Mark all live inserts
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      // Only process Inserts and composite Phis
      spv::Op op = ii->opcode();
      Instruction* typeInst = get_def_use_mgr()->GetDef(ii->type_id());
      if (op != spv::Op::OpCompositeInsert &&
          (op != spv::Op::OpPhi || !spvOpcodeIsComposite(typeInst->opcode())))
        continue;
      // The marking algorithm can be expensive for large arrays and the
      // efficacy of eliminating dead inserts into arrays is questionable.
      // Skip optimizing array inserts for now. Just mark them live.
      // TODO(greg-lunarg): Eliminate dead array inserts
      if (op == spv::Op::OpCompositeInsert) {
        if (typeInst->opcode() == spv::Op::OpTypeArray) {
          liveInserts_.insert(ii->result_id());
          continue;
        }
      }
      const uint32_t id = ii->result_id();
      get_def_use_mgr()->ForEachUser(id, [&ii, this](Instruction* user) {
        if (user->IsCommonDebugInstr()) return;
        switch (user->opcode()) {
          case spv::Op::OpCompositeInsert:
          case spv::Op::OpPhi:
            // Use by insert or phi does not initiate marking
            break;
          case spv::Op::OpCompositeExtract: {
            // Capture extract indices
            std::vector<uint32_t> extIndices;
            uint32_t icnt = 0;
            user->ForEachInOperand([&icnt, &extIndices](const uint32_t* idp) {
              if (icnt > 0) extIndices.push_back(*idp);
              ++icnt;
            });
            // Mark all inserts in chain that intersect with extract
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, &extIndices, 0, &visited_phis);
          } break;
          default: {
            // Mark inserts in chain for all components
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, nullptr, 0, &visited_phis);
          } break;
        }
      });
    }
  }
  // Find and disconnect dead inserts
  std::vector<Instruction*> dead_instructions;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      if (ii->opcode() != spv::Op::OpCompositeInsert) continue;
      const uint32_t id = ii->result_id();
      if (liveInserts_.find(id) != liveInserts_.end()) continue;
      const uint32_t replId =
          ii->GetSingleWordInOperand(kInsertCompositeIdInIdx);
      (void)context()->ReplaceAllUsesWith(id, replId);
      dead_instructions.push_back(&*ii);
      modified = true;
    }
  }
  // DCE dead inserts
  while (!dead_instructions.empty()) {
    Instruction* inst = dead_instructions.back();
    dead_instructions.pop_back();
    DCEInst(inst, [&dead_instructions](Instruction* other_inst) {
      auto i = std::find(dead_instructions.begin(), dead_instructions.end(),
                         other_inst);
      if (i != dead_instructions.end()) {
        dead_instructions.erase(i);
      }
    });
  }
  return modified;
}